

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::simplify
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *this_00;
  element_type *peVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  double s_;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->lhs_);
  uVar1 = (*peVar3->_vptr_rt_expression_interface[8])();
  if ((uVar1 & 1) != 0) {
    peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->rhs_);
    uVar1 = (*peVar3->_vptr_rt_expression_interface[8])();
    if ((uVar1 & 1) != 0) {
      this_00 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
                operator_new(0x10);
      (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[9])();
      rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(this_00,s_);
      return &this_00->super_rt_expression_interface<double>;
    }
  }
  peVar4 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
           operator->(&this->op_);
  peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::get(&this->lhs_);
  peVar5 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::get(&this->rhs_);
  iVar2 = (*peVar4->_vptr_op_interface[9])(peVar4,peVar3,peVar5);
  return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
}

Assistant:

InterfaceType * simplify() const
      {
        if (lhs_->is_constant() && rhs_->is_constant())
          return new rt_constant<numeric_type, InterfaceType>( unwrap() );

        //std::cout << "Optimization forwarded to " << op_->str() << std::endl;
        return op_->simplify(lhs_.get(), rhs_.get());
      }